

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O3

uint128 absl::operator%(uint128 lhs,uint128 rhs)

{
  uint128 uVar1;
  
  uVar1 = (uint128)__umodti3(lhs.lo_,lhs.hi_,rhs.lo_,rhs.hi_);
  return uVar1;
}

Assistant:

uint128 operator%(uint128 lhs, uint128 rhs) {
#if defined(ABSL_HAVE_INTRINSIC_INT128)
  return static_cast<unsigned __int128>(lhs) %
         static_cast<unsigned __int128>(rhs);
#else  // ABSL_HAVE_INTRINSIC_INT128
  uint128 quotient = 0;
  uint128 remainder = 0;
  DivModImpl(lhs, rhs, &quotient, &remainder);
  return remainder;
#endif  // ABSL_HAVE_INTRINSIC_INT128
}